

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedRun.cpp
# Opt level: O1

void __thiscall IntersectionHelper::step_single(IntersectionHelper *this)

{
  uint8_t uVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  uint *puVar5;
  uint32_t uVar6;
  uint uVar7;
  uint8_t *pos;
  
  iVar2 = this->prev_;
  pos = this->run_it_;
  uVar6 = run_read(pos);
  uVar7 = uVar6 + iVar2;
  puVar4 = this->seq_it_;
  uVar3 = *puVar4;
  if (uVar7 < uVar3) {
    this->prev_ = uVar7;
    do {
      uVar1 = *pos;
      pos = pos + 1;
    } while ((char)uVar1 < '\0');
    this->run_it_ = pos;
  }
  else {
    if (uVar7 == uVar3) {
      puVar5 = this->seq_out_;
      this->seq_out_ = puVar5 + 1;
      *puVar5 = uVar3;
      this->prev_ = uVar7;
      do {
        uVar1 = *pos;
        pos = pos + 1;
      } while ((char)uVar1 < '\0');
      this->run_it_ = pos;
    }
    this->seq_it_ = puVar4 + 1;
  }
  return;
}

Assistant:

void IntersectionHelper::step_single() {
    uint32_t next = prev_ + run_read(run_it_);
    if (next < *seq_it_) {
        prev_ = next;
        run_it_ = run_forward(run_it_);
        return;
    }
    if (*seq_it_ == next) {
        *seq_out_++ = *seq_it_;
        prev_ = next;
        run_it_ = run_forward(run_it_);
    }
    seq_it_++;
}